

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void testing::internal::XmlUnitTestResultPrinter::OutputXmlTestSuiteForTestResult
               (ostream *stream,TestResult *result)

{
  TimeInMillis ms;
  TimeInMillis ms_00;
  TimeInMillis ms_01;
  TimeInMillis ms_02;
  string local_80;
  string local_60;
  string local_40;
  allocator local_1b;
  allocator local_1a;
  allocator local_19;
  
  std::operator<<(stream,"  <testsuite");
  std::__cxx11::string::string((string *)&local_80,"testsuite",&local_1a);
  std::__cxx11::string::string((string *)&local_60,"name",&local_19);
  std::__cxx11::string::string((string *)&local_40,"NonTestSuiteFailure",&local_1b);
  OutputXmlAttribute(stream,&local_80,&local_60,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::string((string *)&local_80,"testsuite",&local_1a);
  std::__cxx11::string::string((string *)&local_60,"tests",&local_19);
  std::__cxx11::string::string((string *)&local_40,"1",&local_1b);
  OutputXmlAttribute(stream,&local_80,&local_60,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::string((string *)&local_80,"testsuite",&local_1a);
  std::__cxx11::string::string((string *)&local_60,"failures",&local_19);
  std::__cxx11::string::string((string *)&local_40,"1",&local_1b);
  OutputXmlAttribute(stream,&local_80,&local_60,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::string((string *)&local_80,"testsuite",&local_1a);
  std::__cxx11::string::string((string *)&local_60,"disabled",&local_19);
  std::__cxx11::string::string((string *)&local_40,"0",&local_1b);
  OutputXmlAttribute(stream,&local_80,&local_60,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::string((string *)&local_80,"testsuite",&local_1a);
  std::__cxx11::string::string((string *)&local_60,"skipped",&local_19);
  std::__cxx11::string::string((string *)&local_40,"0",&local_1b);
  OutputXmlAttribute(stream,&local_80,&local_60,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::string((string *)&local_80,"testsuite",&local_1a);
  std::__cxx11::string::string((string *)&local_60,"errors",&local_19);
  std::__cxx11::string::string((string *)&local_40,"0",&local_1b);
  OutputXmlAttribute(stream,&local_80,&local_60,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::string((string *)&local_80,"testsuite",&local_1a);
  std::__cxx11::string::string((string *)&local_60,"time",&local_19);
  FormatTimeInMillisAsSeconds_abi_cxx11_(&local_40,(internal *)result->elapsed_time_,ms);
  OutputXmlAttribute(stream,&local_80,&local_60,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::string((string *)&local_80,"testsuite",&local_1a);
  std::__cxx11::string::string((string *)&local_60,"timestamp",&local_19);
  FormatEpochTimeInMillisAsIso8601_abi_cxx11_(&local_40,(internal *)result->start_timestamp_,ms_00);
  OutputXmlAttribute(stream,&local_80,&local_60,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  std::operator<<(stream,">");
  std::operator<<(stream,"    <testcase");
  std::__cxx11::string::string((string *)&local_80,"testcase",&local_1a);
  std::__cxx11::string::string((string *)&local_60,"name",&local_19);
  std::__cxx11::string::string((string *)&local_40,"",&local_1b);
  OutputXmlAttribute(stream,&local_80,&local_60,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::string((string *)&local_80,"testcase",&local_1a);
  std::__cxx11::string::string((string *)&local_60,"status",&local_19);
  std::__cxx11::string::string((string *)&local_40,"run",&local_1b);
  OutputXmlAttribute(stream,&local_80,&local_60,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::string((string *)&local_80,"testcase",&local_1a);
  std::__cxx11::string::string((string *)&local_60,"result",&local_19);
  std::__cxx11::string::string((string *)&local_40,"completed",&local_1b);
  OutputXmlAttribute(stream,&local_80,&local_60,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::string((string *)&local_80,"testcase",&local_1a);
  std::__cxx11::string::string((string *)&local_60,"classname",&local_19);
  std::__cxx11::string::string((string *)&local_40,"",&local_1b);
  OutputXmlAttribute(stream,&local_80,&local_60,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::string((string *)&local_80,"testcase",&local_1a);
  std::__cxx11::string::string((string *)&local_60,"time",&local_19);
  FormatTimeInMillisAsSeconds_abi_cxx11_(&local_40,(internal *)result->elapsed_time_,ms_01);
  OutputXmlAttribute(stream,&local_80,&local_60,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::string((string *)&local_80,"testcase",&local_1a);
  std::__cxx11::string::string((string *)&local_60,"timestamp",&local_19);
  FormatEpochTimeInMillisAsIso8601_abi_cxx11_(&local_40,(internal *)result->start_timestamp_,ms_02);
  OutputXmlAttribute(stream,&local_80,&local_60,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  OutputXmlTestResult(stream,result);
  std::operator<<(stream,"  </testsuite>\n");
  return;
}

Assistant:

void XmlUnitTestResultPrinter::OutputXmlTestSuiteForTestResult(
    ::std::ostream* stream, const TestResult& result) {
  // Output the boilerplate for a minimal test suite with one test.
  *stream << "  <testsuite";
  OutputXmlAttribute(stream, "testsuite", "name", "NonTestSuiteFailure");
  OutputXmlAttribute(stream, "testsuite", "tests", "1");
  OutputXmlAttribute(stream, "testsuite", "failures", "1");
  OutputXmlAttribute(stream, "testsuite", "disabled", "0");
  OutputXmlAttribute(stream, "testsuite", "skipped", "0");
  OutputXmlAttribute(stream, "testsuite", "errors", "0");
  OutputXmlAttribute(stream, "testsuite", "time",
                     FormatTimeInMillisAsSeconds(result.elapsed_time()));
  OutputXmlAttribute(
      stream, "testsuite", "timestamp",
      FormatEpochTimeInMillisAsIso8601(result.start_timestamp()));
  *stream << ">";

  // Output the boilerplate for a minimal test case with a single test.
  *stream << "    <testcase";
  OutputXmlAttribute(stream, "testcase", "name", "");
  OutputXmlAttribute(stream, "testcase", "status", "run");
  OutputXmlAttribute(stream, "testcase", "result", "completed");
  OutputXmlAttribute(stream, "testcase", "classname", "");
  OutputXmlAttribute(stream, "testcase", "time",
                     FormatTimeInMillisAsSeconds(result.elapsed_time()));
  OutputXmlAttribute(
      stream, "testcase", "timestamp",
      FormatEpochTimeInMillisAsIso8601(result.start_timestamp()));

  // Output the actual test result.
  OutputXmlTestResult(stream, result);

  // Complete the test suite.
  *stream << "  </testsuite>\n";
}